

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStore(TranslateToFuzzReader *this,Type type)

{
  uint32_t uVar1;
  Expression *pEVar2;
  
  if ((this->allowMemory == true) && ((type.id & 1) != 0 || type.id < 7)) {
    pEVar2 = makeNonAtomicStore(this,type);
    if ((pEVar2->_id == StoreId) &&
       (((*(ulong *)(pEVar2[3].type.id + 8) & 0xfffffffffffffffe) == 2 &&
        (((this->wasm->features).features & 1) != 0)))) {
      uVar1 = Random::upTo(&this->random,2);
      if (uVar1 != 0) {
        *(undefined1 *)
         ((long)(((this->wasm->memories).
                  super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> + 0x48) = 1;
        *(undefined1 *)&pEVar2[2].type.id = 1;
        *(ulong *)(pEVar2 + 2) = (ulong)pEVar2[1]._id;
      }
    }
    return pEVar2;
  }
  pEVar2 = makeTrivial(this,type);
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeStore(Type type) {
  if (!allowMemory || type.isRef()) {
    return makeTrivial(type);
  }
  auto* ret = makeNonAtomicStore(type);
  auto* store = ret->dynCast<Store>();
  if (!store) {
    return ret;
  }
  if (store->value->type != Type::i32 && store->value->type != Type::i64) {
    return store;
  }
  if (!wasm.features.hasAtomics() || oneIn(2)) {
    return store;
  }
  // make it atomic
  wasm.memories[0]->shared = true;
  store->isAtomic = true;
  store->align = store->bytes;
  return store;
}